

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

ostream * __thiscall
inja::Environment::render_to(Environment *this,ostream *os,Template *tmpl,json *data)

{
  _Head_base<0UL,_inja::Environment::Impl_*,_false> _Var1;
  undefined1 local_90 [112];
  
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_inja::Environment::Impl_*,_std::default_delete<inja::Environment::Impl>_>
       .super__Head_base<0UL,_inja::Environment::Impl_*,_false>._M_head_impl;
  Renderer::Renderer((Renderer *)local_90,&(_Var1._M_head_impl)->included_templates,
                     &(_Var1._M_head_impl)->callbacks);
  Renderer::render_to((Renderer *)local_90,os,tmpl,data);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)(local_90 + 0x60));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_90 + 0x68),local_90[0x60]);
  if ((pointer)local_90._72_8_ != (pointer)0x0) {
    operator_delete((void *)local_90._72_8_);
  }
  std::vector<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>::~vector
            ((vector<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_> *)
             (local_90 + 0x28));
  std::
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::~vector((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             *)(local_90 + 0x10));
  return os;
}

Assistant:

std::ostream& render_to(std::ostream& os, const Template& tmpl, const json& data) {
		Renderer(m_impl->included_templates, m_impl->callbacks).render_to(os, tmpl, data);
		return os;
	}